

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool __thiscall
Catch::TeamCityReporter::assertionEnded(TeamCityReporter *this,AssertionStats *assertionStats)

{
  bool bVar1;
  OfType OVar2;
  ostream *poVar3;
  ReusableStringStream *pRVar4;
  size_type sVar5;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  char local_121;
  string local_120;
  string local_100;
  char local_d9;
  reference local_d8;
  MessageInfo *messageInfo;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *__range2;
  string local_a8;
  ReusableStringStream local_88;
  string local_78;
  char local_51;
  SourceLineInfo local_50 [2];
  undefined1 local_30 [8];
  ReusableStringStream msg;
  AssertionResult *result;
  AssertionStats *assertionStats_local;
  TeamCityReporter *this_local;
  
  msg.m_oss = (ostream *)assertionStats;
  bVar1 = AssertionResult::isOk(&assertionStats->assertionResult);
  if (bVar1) {
LAB_002c70f4:
    std::ostream::flush();
    return true;
  }
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_30);
  if ((this->m_headerPrintedForThisSection & 1U) == 0) {
    poVar3 = ReusableStringStream::get((ReusableStringStream *)local_30);
    printSectionHeader(this,poVar3);
  }
  this->m_headerPrintedForThisSection = true;
  local_50[0] = AssertionResult::getSourceInfo((AssertionResult *)msg.m_oss);
  pRVar4 = ReusableStringStream::operator<<((ReusableStringStream *)local_30,local_50);
  local_51 = '\n';
  ReusableStringStream::operator<<(pRVar4,&local_51);
  OVar2 = AssertionResult::getResultType((AssertionResult *)msg.m_oss);
  if (OVar2 != Unknown) {
    if ((uint)OVar2 < 3) {
      ReusableStringStream::ReusableStringStream(&local_88);
      pRVar4 = ReusableStringStream::operator<<
                         (&local_88,(char (*) [36])"Internal error in TeamCity reporter");
      ReusableStringStream::str_abi_cxx11_(&local_78,pRVar4);
      throw_domain_error(&local_78);
    }
    if (OVar2 != FailureBit) {
      if (OVar2 == ExpressionFailed) {
        ReusableStringStream::operator<<
                  ((ReusableStringStream *)local_30,(char (*) [18])"expression failed");
      }
      else if (OVar2 == ExplicitFailure) {
        ReusableStringStream::operator<<
                  ((ReusableStringStream *)local_30,(char (*) [17])"explicit failure");
      }
      else {
        if (OVar2 == Exception) goto LAB_002c6ac9;
        if (OVar2 == ThrewException) {
          ReusableStringStream::operator<<
                    ((ReusableStringStream *)local_30,(char (*) [21])"unexpected exception");
        }
        else if (OVar2 == DidntThrowException) {
          ReusableStringStream::operator<<((ReusableStringStream *)local_30,(char (*) [47])0x3665c4)
          ;
        }
        else if (OVar2 == FatalErrorCondition) {
          ReusableStringStream::operator<<((ReusableStringStream *)local_30,(char (*) [22])0x3665a6)
          ;
        }
      }
      sVar5 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                        (&assertionStats->infoMessages);
      if (sVar5 == 1) {
        ReusableStringStream::operator<<((ReusableStringStream *)local_30,(char (*) [15])0x366414);
      }
      sVar5 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                        (&assertionStats->infoMessages);
      if (1 < sVar5) {
        ReusableStringStream::operator<<
                  ((ReusableStringStream *)local_30,(char (*) [16])" with messages:");
      }
      __end2 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                         (&assertionStats->infoMessages);
      messageInfo = (MessageInfo *)
                    std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
                              (&assertionStats->infoMessages);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                                         *)&messageInfo), bVar1) {
        local_d8 = __gnu_cxx::
                   __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                   ::operator*(&__end2);
        pRVar4 = ReusableStringStream::operator<<
                           ((ReusableStringStream *)local_30,(char (*) [5])"\n  \"");
        pRVar4 = ReusableStringStream::operator<<(pRVar4,&local_d8->message);
        local_d9 = '\"';
        ReusableStringStream::operator<<(pRVar4,&local_d9);
        __gnu_cxx::
        __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
        ::operator++(&__end2);
      }
      bVar1 = AssertionResult::hasExpression((AssertionResult *)msg.m_oss);
      if (bVar1) {
        pRVar4 = ReusableStringStream::operator<<
                           ((ReusableStringStream *)local_30,(char (*) [4])0x36591a);
        AssertionResult::getExpressionInMacro_abi_cxx11_(&local_100,(AssertionResult *)msg.m_oss);
        pRVar4 = ReusableStringStream::operator<<(pRVar4,&local_100);
        pRVar4 = ReusableStringStream::operator<<(pRVar4,(char (*) [20])"\nwith expansion:\n  ");
        AssertionResult::getExpandedExpression_abi_cxx11_(&local_120,(AssertionResult *)msg.m_oss);
        pRVar4 = ReusableStringStream::operator<<(pRVar4,&local_120);
        local_121 = '\n';
        ReusableStringStream::operator<<(pRVar4,&local_121);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_100);
      }
      bVar1 = TestCaseInfo::okToFail((this->super_StreamingReporterBase).currentTestCaseInfo);
      if (bVar1) {
        ReusableStringStream::operator<<
                  ((ReusableStringStream *)local_30,
                   (char (*) [49])"- failure ignore as test marked as \'ok to fail\'\n");
        poVar3 = std::operator<<((this->super_StreamingReporterBase).stream,"##teamcity[testIgnored"
                                );
        poVar3 = std::operator<<(poVar3," name=\'");
        anon_unknown_23::escape
                  (&local_148,&((this->super_StreamingReporterBase).currentTestCaseInfo)->name);
        poVar3 = std::operator<<(poVar3,(string *)&local_148);
        poVar3 = std::operator<<(poVar3,'\'');
        poVar3 = std::operator<<(poVar3," message=\'");
        ReusableStringStream::str_abi_cxx11_(&local_188,(ReusableStringStream *)local_30);
        anon_unknown_23::escape(&local_168,&local_188);
        poVar3 = std::operator<<(poVar3,(string *)&local_168);
        poVar3 = std::operator<<(poVar3,'\'');
        std::operator<<(poVar3,"]\n");
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)&local_148);
      }
      else {
        poVar3 = std::operator<<((this->super_StreamingReporterBase).stream,"##teamcity[testFailed")
        ;
        poVar3 = std::operator<<(poVar3," name=\'");
        anon_unknown_23::escape
                  (&local_1a8,&((this->super_StreamingReporterBase).currentTestCaseInfo)->name);
        poVar3 = std::operator<<(poVar3,(string *)&local_1a8);
        poVar3 = std::operator<<(poVar3,'\'');
        poVar3 = std::operator<<(poVar3," message=\'");
        ReusableStringStream::str_abi_cxx11_(&local_1e8,(ReusableStringStream *)local_30);
        anon_unknown_23::escape(&local_1c8,&local_1e8);
        poVar3 = std::operator<<(poVar3,(string *)&local_1c8);
        poVar3 = std::operator<<(poVar3,'\'');
        std::operator<<(poVar3,"]\n");
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_1a8);
      }
      ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_30);
      goto LAB_002c70f4;
    }
  }
LAB_002c6ac9:
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)&__range2);
  pRVar4 = ReusableStringStream::operator<<
                     ((ReusableStringStream *)&__range2,(char (*) [16])"Not implemented");
  ReusableStringStream::str_abi_cxx11_(&local_a8,pRVar4);
  throw_domain_error(&local_a8);
}

Assistant:

bool TeamCityReporter::assertionEnded(AssertionStats const &assertionStats) {
        AssertionResult const &result = assertionStats.assertionResult;
        if (!result.isOk()) {

            ReusableStringStream msg;
            if (!m_headerPrintedForThisSection)
                printSectionHeader(msg.get());
            m_headerPrintedForThisSection = true;

            msg << result.getSourceInfo() << '\n';

            switch (result.getResultType()) {
            case ResultWas::ExpressionFailed:
                msg << "expression failed";
                break;
            case ResultWas::ThrewException:
                msg << "unexpected exception";
                break;
            case ResultWas::FatalErrorCondition:
                msg << "fatal error condition";
                break;
            case ResultWas::DidntThrowException:
                msg << "no exception was thrown where one was expected";
                break;
            case ResultWas::ExplicitFailure:
                msg << "explicit failure";
                break;

                // We shouldn't get here because of the isOk() test
            case ResultWas::Ok:
            case ResultWas::Info:
            case ResultWas::Warning:
                CATCH_ERROR("Internal error in TeamCity reporter");
                // These cases are here to prevent compiler warnings
            case ResultWas::Unknown:
            case ResultWas::FailureBit:
            case ResultWas::Exception:
                CATCH_ERROR("Not implemented");
            }
            if (assertionStats.infoMessages.size() == 1)
                msg << " with message:";
            if (assertionStats.infoMessages.size() > 1)
                msg << " with messages:";
            for (auto const &messageInfo : assertionStats.infoMessages)
                msg << "\n  \"" << messageInfo.message << '"';


            if (result.hasExpression()) {
                msg <<
                    "\n  " << result.getExpressionInMacro() << "\n"
                    "with expansion:\n"
                    "  " << result.getExpandedExpression() << '\n';
            }

            if (currentTestCaseInfo->okToFail()) {
                msg << "- failure ignore as test marked as 'ok to fail'\n";
                stream << "##teamcity[testIgnored"
                    << " name='" << escape(currentTestCaseInfo->name) << '\''
                    << " message='" << escape(msg.str()) << '\''
                    << "]\n";
            }
            else {
                stream << "##teamcity[testFailed"
                    << " name='" << escape(currentTestCaseInfo->name) << '\''
                    << " message='" << escape(msg.str()) << '\''
                    << "]\n";
            }
        }
        stream.flush();
        return true;
    }